

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O0

void Aig_RManTableResize(Aig_RMan_t *p)

{
  int iVar1;
  Aig_Tru_t **__ptr;
  int iVar2;
  Aig_Tru_t **ppAVar3;
  Aig_Tru_t *local_58;
  Aig_Tru_t *local_50;
  abctime clk;
  int local_38;
  int i;
  int Counter;
  int nBinsOld;
  Aig_Tru_t **ppPlace;
  Aig_Tru_t **pBinsOld;
  Aig_Tru_t *pNext;
  Aig_Tru_t *pEntry;
  Aig_RMan_t *p_local;
  
  if (p->pBins == (Aig_Tru_t **)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigCanon.c"
                  ,0xb4,"void Aig_RManTableResize(Aig_RMan_t *)");
  }
  Abc_Clock();
  __ptr = p->pBins;
  iVar1 = p->nBins;
  iVar2 = Abc_PrimeCudd(iVar1 * 3);
  p->nBins = iVar2;
  ppAVar3 = (Aig_Tru_t **)calloc((long)p->nBins,8);
  p->pBins = ppAVar3;
  local_38 = 0;
  clk._4_4_ = 0;
  do {
    if (iVar1 <= clk._4_4_) {
      if (local_38 != p->nEntries) {
        __assert_fail("Counter == p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigCanon.c"
                      ,0xca,"void Aig_RManTableResize(Aig_RMan_t *)");
      }
      if (__ptr != (Aig_Tru_t **)0x0) {
        free(__ptr);
      }
      return;
    }
    pNext = __ptr[clk._4_4_];
    if (pNext == (Aig_Tru_t *)0x0) {
      local_50 = (Aig_Tru_t *)0x0;
    }
    else {
      local_50 = pNext->pNext;
    }
    pBinsOld = &local_50->pNext;
    while (pNext != (Aig_Tru_t *)0x0) {
      ppAVar3 = Aig_RManTableLookup(p,(uint *)(pNext + 1),*(uint *)&pNext->field_0xc >> 0x1b);
      if (*ppAVar3 != (Aig_Tru_t *)0x0) {
        __assert_fail("*ppPlace == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigCanon.c"
                      ,0xc4,"void Aig_RManTableResize(Aig_RMan_t *)");
      }
      *ppAVar3 = pNext;
      pNext->pNext = (Aig_Tru_t *)0x0;
      local_38 = local_38 + 1;
      pNext = (Aig_Tru_t *)pBinsOld;
      if (pBinsOld == (Aig_Tru_t **)0x0) {
        local_58 = (Aig_Tru_t *)0x0;
      }
      else {
        local_58 = *pBinsOld;
      }
      pBinsOld = &local_58->pNext;
    }
    clk._4_4_ = clk._4_4_ + 1;
  } while( true );
}

Assistant:

void Aig_RManTableResize( Aig_RMan_t * p )
{
    Aig_Tru_t * pEntry, * pNext;
    Aig_Tru_t ** pBinsOld, ** ppPlace;
    int nBinsOld, Counter, i;
    abctime clk;
    assert( p->pBins != NULL );
clk = Abc_Clock();
    // save the old Bins
    pBinsOld = p->pBins;
    nBinsOld = p->nBins;
    // get the new Bins
    p->nBins = Abc_PrimeCudd( 3 * nBinsOld ); 
    p->pBins = ABC_CALLOC( Aig_Tru_t *, p->nBins );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nBinsOld; i++ )
    for ( pEntry = pBinsOld[i], pNext = pEntry? pEntry->pNext : NULL; 
          pEntry; pEntry = pNext, pNext = pEntry? pEntry->pNext : NULL )
    {
        // get the place where this entry goes in the Bins 
        ppPlace = Aig_RManTableLookup( p, pEntry->pTruth, pEntry->nVars );
        assert( *ppPlace == NULL ); // should not be there
        // add the entry to the list
        *ppPlace = pEntry;
        pEntry->pNext = NULL;
        Counter++;
    }
    assert( Counter == p->nEntries );
//    ABC_PRT( "Time", Abc_Clock() - clk );
    ABC_FREE( pBinsOld );
}